

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void render(size_t *width,size_t *height,
           vector<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_> *buffer,float interocular)

{
  undefined4 uVar1;
  undefined4 uVar2;
  size_t sVar3;
  pointer pVVar4;
  Scene *this;
  long lVar5;
  long lVar6;
  long lVar7;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  undefined4 in_XMM0_Db;
  allocator_type local_9d;
  float local_9c;
  undefined8 local_98;
  size_t right_width;
  size_t left_width;
  vector<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_> right_buffer;
  vector<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_> left_buffer;
  
  local_98 = (Scene *)CONCAT44(in_XMM0_Db,interocular);
  this = setup_scene();
  if (((float)local_98 != 0.0) || (NAN((float)local_98))) {
    uVar11 = *width >> 1;
    right_width = *width - uVar11;
    left_width = uVar11;
    std::vector<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>::vector
              (&left_buffer,*height * uVar11,(allocator_type *)&right_buffer);
    std::vector<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>::vector
              (&right_buffer,uVar11 * *height,&local_9d);
    local_98._0_4_ = (float)local_98 * 0.5;
    uVar1 = (this->camera).position.x;
    uVar2 = (this->camera).position.y;
    local_9c = (this->camera).position.z;
    (this->camera).position.x = (float)local_98 + (float)uVar1;
    (this->camera).position.y = (float)uVar2 + 0.0;
    (this->camera).position.z = local_9c + 0.0;
    Scene::render(this,&left_width,height,&left_buffer);
    (this->camera).position.x = (float)uVar1 - (float)local_98;
    (this->camera).position.y = (float)uVar2;
    (this->camera).position.z = local_9c;
    Scene::render(this,&right_width,height,&right_buffer);
    (this->camera).position.x = (float)uVar1;
    (this->camera).position.y = (float)uVar2;
    (this->camera).position.z = local_9c;
    lVar5 = 0;
    lVar6 = 0;
    for (uVar11 = 0; uVar9 = *height, uVar11 < uVar9; uVar11 = uVar11 + 1) {
      lVar7 = 0;
      sVar8 = left_width;
      while (bVar12 = sVar8 != 0, sVar8 = sVar8 - 1, bVar12) {
        sVar3 = *width;
        pVVar4 = (buffer->super__Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        *(undefined4 *)((long)&pVVar4->z + lVar7 + sVar3 * lVar6) =
             *(undefined4 *)
              ((long)&(left_buffer.
                       super__Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start)->z + lVar7 + lVar5);
        *(undefined8 *)((long)&pVVar4->x + lVar7 + sVar3 * lVar6) =
             *(undefined8 *)
              ((long)&(left_buffer.
                       super__Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start)->x + lVar7 + lVar5);
        lVar7 = lVar7 + 0xc;
      }
      lVar6 = lVar6 + 0xc;
      lVar5 = lVar5 + left_width * 0xc;
    }
    lVar5 = 0;
    lVar6 = 0;
    for (uVar11 = 0; lVar7 = lVar5, lVar10 = left_width * 0xc, sVar8 = left_width, uVar11 < uVar9;
        uVar11 = uVar11 + 1) {
      while (bVar12 = sVar8 != 0, sVar8 = sVar8 - 1, bVar12) {
        sVar3 = *width;
        pVVar4 = (buffer->super__Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        *(undefined4 *)((long)&pVVar4->z + lVar10 + sVar3 * lVar6) =
             *(undefined4 *)
              ((long)&(right_buffer.
                       super__Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start)->z + lVar7);
        *(undefined8 *)((long)&pVVar4->x + lVar10 + sVar3 * lVar6) =
             *(undefined8 *)
              ((long)&(right_buffer.
                       super__Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start)->x + lVar7);
        lVar10 = lVar10 + 0xc;
        lVar7 = lVar7 + 0xc;
      }
      uVar9 = *height;
      lVar6 = lVar6 + 0xc;
      lVar5 = lVar5 + right_width * 0xc;
    }
    local_98 = this;
    std::_Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>::~_Vector_base
              (&right_buffer.super__Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>)
    ;
    std::_Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>::~_Vector_base
              (&left_buffer.super__Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>);
    this = local_98;
  }
  else {
    Scene::render(this,width,height,buffer);
  }
  Scene::~Scene(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

void render(const size_t &width, const size_t &height, std::vector<Vec3f> &buffer, const float interocular = 0) {
    Scene *scene = setup_scene();

    // Render a side-by-side 3d rendering if the interocular distance is nonzero.
    if (interocular == 0) {
        scene->render(width, height, buffer);
    } else {
        // Use two buffers in case of odd resolutions.
        const size_t left_width = width / 2;
        const size_t right_width = width - left_width;
        std::vector<Vec3f> left_buffer(left_width * height);
        std::vector<Vec3f> right_buffer(left_width * height);

        Vec3f eye_transformation(interocular / 2, 0, 0);
        Pos3f orig_cam_pos = scene->camera.position;

        // Render the left eye.
        scene->camera.position = orig_cam_pos + eye_transformation;
        scene->render(left_width, height, left_buffer);

        // Now the right.
        scene->camera.position = orig_cam_pos - eye_transformation;
        scene->render(right_width, height, right_buffer);

        // Don't forget to reset the camera position.
        scene->camera.position = orig_cam_pos;

        // Stitch the views together into the output buffer.
        for (size_t j = 0; j < height; j++) {
            for (size_t i = 0; i < left_width; i++) {
                buffer[i + j * width] = left_buffer[i + j * left_width];
            }
        }
        for (size_t j = 0; j < height; j++) {
            for (size_t i = 0; i < left_width; i++) {
                buffer[i + left_width + j * width] = right_buffer[i + j * right_width];
            }
        }
    }

    delete scene;
}